

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::send_reconnect_request(raft_server *this)

{
  element_type *peVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  string local_88;
  ptr<peer> p_leader;
  ptr<req_msg> req;
  int local_44 [3];
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_38;
  unique_lock<std::recursive_mutex> guard;
  
  std::unique_lock<std::recursive_mutex>::unique_lock(&guard,&this->lock_);
  if ((this->leader_).super___atomic_base<int>._M_i == this->id_) {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      iVar4 = (**(code **)(*(long *)peVar1 + 0x38))();
      if (1 < iVar4) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  (&local_88,"this node %d is leader, cannot send reconnect request",
                   (ulong)(uint)this->id_);
        (**(code **)(*(long *)peVar1 + 0x40))
                  (peVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"send_reconnect_request",0x382,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
    }
  }
  else {
    local_88._M_dataplus._M_p._0_4_ = (this->leader_).super___atomic_base<int>._M_i;
    iVar5 = std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->peers_)._M_h,(key_type_conflict *)&local_88);
    if (iVar5.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 != (element_type *)0x0) {
        iVar4 = (**(code **)(*(long *)peVar1 + 0x38))();
        if (0 < iVar4) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_(&local_88,"cannot find leader!");
          (**(code **)(*(long *)peVar1 + 0x40))
                    (peVar1,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"send_reconnect_request",0x399,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
        }
      }
      plVar2 = *(long **)&(((this->ctx_)._M_t.
                            super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                            .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                          state_mgr_).
                          super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar2 + 0x40))(plVar2,0xffffffffffffffea);
    }
    else {
      std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&p_leader.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)iVar5.
                        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                        ._M_cur + 0x10));
      local_88._M_dataplus._M_p =
           (pointer)(((this->state_).
                      super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    term_).super___atomic_base<unsigned_long>._M_i;
      local_44[2] = 0x1a;
      local_44[1] = 0;
      local_44[0] = 0;
      std::
      make_shared<nuraft::req_msg,unsigned_long,nuraft::msg_type,int&,std::atomic<int>&,int,int,int>
                ((unsigned_long *)&req,(msg_type *)&local_88,local_44 + 2,(atomic<int> *)&this->id_,
                 (int *)&this->leader_,local_44 + 1,local_44);
      bVar3 = peer::make_busy(p_leader.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
      if (bVar3) {
        std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_38,&p_leader.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)
        ;
        peer::send_req(p_leader.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (ptr<peer> *)&local_38,&req,&this->ex_resp_handler_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
      }
      else {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1 != (element_type *)0x0) {
          iVar4 = (**(code **)(*(long *)peVar1 + 0x38))();
          if (1 < iVar4) {
            peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      (&local_88,"previous message to leader %d hasn\'t been responded yet",
                       (ulong)(uint)(((p_leader.
                                       super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr)->config_).
                                     super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->id_);
            (**(code **)(*(long *)peVar1 + 0x40))
                      (peVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                       ,"send_reconnect_request",0x394,&local_88);
            std::__cxx11::string::~string((string *)&local_88);
          }
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p_leader.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&guard);
  return;
}

Assistant:

void raft_server::send_reconnect_request() {
    recur_lock(lock_);

    if (leader_ == id_) {
        p_er("this node %d is leader, "
             "cannot send reconnect request",
             id_);
        return;
    }

    // Find leader object.
    auto entry = peers_.find(leader_);
    if (entry != peers_.end()) {
        ptr<peer> p_leader = entry->second;
        ptr<req_msg> req = cs_new<req_msg>( state_->get_term(),
                                            msg_type::reconnect_request,
                                            id_,
                                            leader_,
                                            0, 0, 0 );

        if (p_leader->make_busy()) {
            p_leader->send_req(p_leader, req, ex_resp_handler_);
        } else {
            p_er("previous message to leader %d hasn't been responded yet",
                 p_leader->get_id());
        }

    } else {
        // LCOV_EXCL_START
        p_ft("cannot find leader!");
        ctx_->state_mgr_->system_exit(N22_unrecoverable_isolation);
        // LCOV_EXCL_STOP
    }
}